

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_builtins.cpp
# Opt level: O0

uint32_t spvtools::val::anon_unknown_0::GetVUIDForBuiltin(BuiltIn builtIn,VUIDError type)

{
  iterator pvVar1;
  value_type *iter;
  iterator __end2;
  iterator __begin2;
  array<spvtools::val::(anonymous_namespace)::BuiltinVUIDMapping,_39UL> *__range2;
  uint32_t vuid;
  VUIDError type_local;
  BuiltIn builtIn_local;
  
  __end2 = std::array<spvtools::val::(anonymous_namespace)::BuiltinVUIDMapping,_39UL>::begin
                     ((array<spvtools::val::(anonymous_namespace)::BuiltinVUIDMapping,_39UL> *)
                      (anonymous_namespace)::builtinVUIDInfo);
  pvVar1 = std::array<spvtools::val::(anonymous_namespace)::BuiltinVUIDMapping,_39UL>::end
                     ((array<spvtools::val::(anonymous_namespace)::BuiltinVUIDMapping,_39UL> *)
                      (anonymous_namespace)::builtinVUIDInfo);
  while( true ) {
    if (__end2 == pvVar1) {
      return 0;
    }
    if (__end2->builtIn == builtIn) break;
    __end2 = __end2 + 1;
  }
  if ((int)type < 3) {
    return __end2->vuid[type];
  }
  __assert_fail("type < VUIDErrorMax",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp"
                ,0xb6,
                "uint32_t spvtools::val::(anonymous namespace)::GetVUIDForBuiltin(spv::BuiltIn, VUIDError)"
               );
}

Assistant:

uint32_t GetVUIDForBuiltin(spv::BuiltIn builtIn, VUIDError type) {
  uint32_t vuid = 0;
  for (const auto& iter: builtinVUIDInfo) {
    if (iter.builtIn == builtIn) {
      assert(type < VUIDErrorMax);
      vuid = iter.vuid[type];
      break;
    }
  }
  return vuid;
}